

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::ruby::LabelForField_abi_cxx11_
          (string *__return_storage_ptr__,ruby *this,FieldDescriptor *field)

{
  int iVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  iVar1 = *(int *)(this + 0x4c);
  if (iVar1 == 3) {
    pcVar3 = "repeated";
    paVar2 = &local_b;
  }
  else if (iVar1 == 2) {
    pcVar3 = "required";
    paVar2 = &local_a;
  }
  else {
    if (iVar1 != 1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
                    ,0x57,
                    "std::string google::protobuf::compiler::ruby::LabelForField(const google::protobuf::FieldDescriptor *)"
                   );
    }
    pcVar3 = "optional";
    paVar2 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string LabelForField(const google::protobuf::FieldDescriptor* field) {
  switch (field->label()) {
    case FieldDescriptor::LABEL_OPTIONAL: return "optional";
    case FieldDescriptor::LABEL_REQUIRED: return "required";
    case FieldDescriptor::LABEL_REPEATED: return "repeated";
    default: assert(false); return "";
  }
}